

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall slang::ast::TypeArgFormatter::TypeArgFormatter(TypeArgFormatter *this)

{
  DiagArgFormatter *in_RDI;
  TypePrinter *in_stack_ffffffffffffffd0;
  unordered_flat_set<const_slang::ast::Type_*,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_fffffffffffffff0;
  
  DiagArgFormatter::DiagArgFormatter(in_RDI);
  in_RDI->_vptr_DiagArgFormatter = (_func_int **)&PTR__TypeArgFormatter_00d82988;
  TypePrinter::TypePrinter(in_stack_ffffffffffffffd0);
  boost::unordered::
  unordered_flat_set<const_slang::ast::Type_*,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::unordered_flat_set(in_stack_fffffffffffffff0);
  boost::unordered::
  unordered_flat_set<const_slang::ast::Type_*,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::unordered_flat_set(in_stack_fffffffffffffff0);
  *(undefined1 *)&in_RDI[1]._vptr_DiagArgFormatter = 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_DiagArgFormatter + 1) = 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_DiagArgFormatter + 2) = 1;
  *(undefined4 *)&in_RDI[2]._vptr_DiagArgFormatter = 1;
  return;
}

Assistant:

TypeArgFormatter::TypeArgFormatter() {
    printer.options.addSingleQuotes = true;
    printer.options.elideScopeNames = true;
    printer.options.printAKA = true;
    printer.options.anonymousTypeStyle = TypePrintingOptions::FriendlyName;
}